

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Platform.cpp
# Opt level: O2

void __thiscall
GmmLib::PlatformInfoGen12::PlatformInfoGen12
          (PlatformInfoGen12 *this,PLATFORM *Platform,Context *pGmmLibContext)

{
  PRODUCT_FAMILY PVar1;
  anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2 aVar2;
  uint32_t uVar3;
  PlatformInfo *pPVar4;
  GMM_PLATFORM_INFO *pGVar5;
  uint8_t uVar6;
  uint32_t uVar7;
  int iVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint64_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  byte bVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  byte bVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2 *paVar29;
  bool bVar30;
  
  PlatformInfoGen11::PlatformInfoGen11(&this->super_PlatformInfoGen11,Platform,pGmmLibContext);
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo._vptr_PlatformInfo =
       (_func_int **)&PTR__PlatformInfo_001d2650;
  if (pGmmLibContext == (Context *)0x0) {
    return;
  }
  aVar2 = (pGmmLibContext->SkuTable).field_1;
  paVar29 = &(pGmmLibContext->SkuTable).field_1;
  uVar16 = '\n';
  uVar6 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar6 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar6 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar6 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[1].
  CompressionFormat.CompressionFormat = uVar6;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[2].
  CompressionFormat.CompressionFormat = uVar16;
  uVar6 = '0';
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[3].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[4].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  uVar15 = '\n';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar15 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar15 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar15 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar15 = '\x18';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[5].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[6].
  CompressionFormat.CompressionFormat = uVar15;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar6 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar6 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[7].
  CompressionFormat.CompressionFormat = uVar6;
  uVar6 = '0';
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[8].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[9].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[10].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xb].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xc].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xd].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar15 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xe].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xf].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\n';
  uVar16 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x10].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x11].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\n';
  uVar16 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x12].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x13].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\n';
  uVar16 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x14].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x15].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar16 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x16].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x17].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  uVar15 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar15 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar15 = '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x18].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x19].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x1a].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x1b].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\x18';
  uVar16 = '\x18';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar16 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x1c].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar15 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x1d].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x18';
  uVar16 = '\x18';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar16 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x1e].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar15 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x1f].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x18';
  uVar16 = '\x18';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar16 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x20].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar15 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x21].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x18';
  uVar16 = '\x18';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar16 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x22].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar15 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x23].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x24].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x25].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x26].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x27].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x28].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x29].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x2a].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x2b].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x2c].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x2d].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x2e].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x2f].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x30].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  bVar14 = 0;
  bVar23 = 0;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (bVar23 = 2, ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (bVar23 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    bVar23 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x31].
  CompressionFormat.CompressionFormat = bVar23;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x32].
  CompressionFormat.CompressionFormat = uVar16;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar6 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar6 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x33].
  CompressionFormat.CompressionFormat = uVar6;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (bVar14 = 2, ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x34].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x35].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x36].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x37].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x38].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x39].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x3a].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x3b].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x3c].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x3d].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  bVar14 = 0;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (bVar14 = 2, ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x3e].
  CompressionFormat.CompressionFormat = bVar14;
  uVar6 = '0';
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x3f].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x40].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x41].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x42].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x43].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x44].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x45].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x46].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x47].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x48].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x49].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x4a].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x4b].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x4c].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x4d].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x4e].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x4f].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x50].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x51].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x52].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x53].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x54].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x55].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x56].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x57].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x58].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x59].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x5a].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x5b].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x5c].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x5d].
  CompressionFormat.CompressionFormat = uVar16;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar6 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar6 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x5e].
  CompressionFormat.CompressionFormat = uVar6;
  uVar6 = '0';
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x5f].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x60].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x61].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x62].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[99].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[100].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x65].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = uVar6;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x66].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '\a', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '\x19';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x67].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '\x19';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x68].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '\x19';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x69].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '\a', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '\x18';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x6a].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '\x18';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x6b].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '\x18';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x6c].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\n';
  uVar16 = '\n';
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar16 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x01', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\v';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x6d].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar15 = '\v';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x6e].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar16 = '\n';
  uVar15 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar15 = '\v';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x6f].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x70].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\n';
  uVar16 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x71].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x02', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\x01', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x72].
  CompressionFormat.CompressionFormat = uVar15;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x73].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x74].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x75].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x76].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x77].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x78].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x79].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\n';
  uVar16 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\t';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x7a].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar15 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar15 = '\t';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x7b].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\n';
  uVar16 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\t';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x7c].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar15 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar15 = '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x7d].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar16 = '\n';
  uVar15 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar15 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar15 = '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x7e].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x7f].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  uVar15 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar15 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar15 = '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x80].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x81].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\n';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x82].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x83].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\x18';
  uVar16 = '\x18';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar16 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x84].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar15 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x85].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x18';
  uVar16 = '\x18';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar16 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x86].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar15 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x87].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x18';
  uVar16 = '\x18';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar16 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x88].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar15 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x89].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x18';
  uVar16 = '\x18';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar16 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x8a].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar15 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x8b].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x18';
  uVar16 = '\x18';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar16 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x8c].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar15 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x8d].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar16 = '\x1e';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar16 = '\x04', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x04';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x8e].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  bVar14 = 0x10;
  bVar23 = 0x10;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (bVar23 = 6, ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (bVar23 = 5, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    bVar23 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 5;
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x8f].
  CompressionFormat.CompressionFormat = bVar23;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (bVar14 = 6, ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (bVar14 = 5, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 5;
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x90].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  bVar14 = 0x10;
  bVar23 = 0x10;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar23 = 0;
    }
    else {
      bVar23 = 5;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar23 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 5;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x91].
  CompressionFormat.CompressionFormat = bVar23;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar14 = 0;
    }
    else {
      bVar14 = 5;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 5;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x92].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  uVar16 = '\x10';
  uVar15 = '\x10';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x06', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\x05', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\x05', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar15 = '\x14';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x93].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      uVar16 = '\0';
    }
    else {
      uVar16 = '\x05';
      if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\x05', ((ulong)aVar2 & 0x400000000) == 0))
      {
        uVar16 = '\x14';
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x94].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  bVar14 = 0x10;
  uVar16 = '\x10';
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      uVar16 = '\0';
    }
    else {
      uVar16 = '\x05';
      if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\x05', ((ulong)aVar2 & 0x400000000) == 0))
      {
        uVar16 = '\x14';
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x95].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar14 = 0;
    }
    else {
      bVar14 = 6;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar14 = ((ulong)aVar2 & 0x400000000) == 0 | 6;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x96].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  bVar14 = 0x10;
  bVar23 = 0x10;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar23 = 0;
    }
    else {
      bVar23 = 6;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar23 = ((ulong)aVar2 & 0x400000000) == 0 | 6;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x97].
  CompressionFormat.CompressionFormat = bVar23;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar14 = 0;
    }
    else {
      bVar14 = 6;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar14 = ((ulong)aVar2 & 0x400000000) == 0 | 6;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x98].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  bVar14 = 0x10;
  bVar23 = 0x10;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar23 = 0;
    }
    else {
      bVar23 = 6;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar23 = ((ulong)aVar2 & 0x400000000) == 0 | 6;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x99].
  CompressionFormat.CompressionFormat = bVar23;
  uVar16 = '\x06';
  uVar15 = uVar16;
  if (((ulong)*paVar29 & 0x442000000) == 0x2000000) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x442020000) == 0x20000) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x9a].
  CompressionFormat.CompressionFormat = uVar15;
  if (((ulong)*paVar29 & 0x442000000) == 0x2000000) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x442020000) == 0x20000) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x9b].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\x06';
  if (((ulong)*paVar29 & 0x442000000) == 0x2000000) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x442020000) == 0x20000) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x9c].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x9d].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x9e].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x9f].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xa0].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xa1].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xa2].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xa3].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar14 = 0;
    }
    else {
      bVar14 = 7;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar14 = (((ulong)aVar2 & 0x400000000) != 0) * '\x02' | 5;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xa4].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  bVar14 = 0x10;
  bVar23 = 0x10;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar23 = 0;
    }
    else {
      bVar23 = 7;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar23 = (((ulong)aVar2 & 0x400000000) != 0) * '\x02' | 5;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xa5].
  CompressionFormat.CompressionFormat = bVar23;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar14 = 0;
    }
    else {
      bVar14 = 7;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar14 = (((ulong)aVar2 & 0x400000000) != 0) * '\x02' | 5;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xa6].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  bVar14 = 0x10;
  bVar23 = 0x10;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar23 = 0;
    }
    else {
      bVar23 = 7;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar23 = (((ulong)aVar2 & 0x400000000) != 0) * '\x02' | 5;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xa7].
  CompressionFormat.CompressionFormat = bVar23;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar14 = 0;
    }
    else {
      bVar14 = 7;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar14 = (((ulong)aVar2 & 0x400000000) != 0) * '\x03' | 4;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xa8].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  bVar14 = 0x10;
  bVar23 = 0x10;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar23 = 0;
    }
    else {
      bVar23 = 7;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar23 = (((ulong)aVar2 & 0x400000000) != 0) * '\x03' | 4;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xa9].
  CompressionFormat.CompressionFormat = bVar23;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar14 = 0;
    }
    else {
      bVar14 = 7;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar14 = (((ulong)aVar2 & 0x400000000) != 0) * '\x03' | 4;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xaa].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  bVar14 = 0x10;
  bVar23 = 0x10;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar23 = 0;
    }
    else {
      bVar23 = 7;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar23 = (((ulong)aVar2 & 0x400000000) != 0) * '\x02' | 5;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xab].
  CompressionFormat.CompressionFormat = bVar23;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar14 = 0;
    }
    else {
      bVar14 = 7;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar14 = (((ulong)aVar2 & 0x400000000) != 0) * '\x03' | 4;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xac].
  CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  uVar15 = '\x11';
  uVar16 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x05', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xad].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x05', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\b' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xae].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar16 = '\x11';
  uVar15 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\b' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xaf].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\b' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xb0].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x11';
  uVar15 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x05', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\b' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xb1].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\b' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xb2].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x11';
  uVar15 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\b' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xb3].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x05', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xb4].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\x11';
  uVar16 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xb5].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xb6].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x11';
  uVar16 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\t', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '\t', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar16 = '\x02';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xb7].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\t', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\t', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar15 = '\x02';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xb8].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x11';
  uVar16 = '\x11';
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar16 = '\t', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\t', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\x02';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xb9].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\t', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\t', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar15 = '\x02';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xba].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x11';
  uVar16 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\t', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '\t', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar16 = '\x02';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xbb].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar15 = '\t', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar15 = '\t', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar15 = '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xbc].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x11';
  uVar16 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\t', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '\t', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar16 = '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xbd].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\t', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\t', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar15 = '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xbe].
  CompressionFormat.CompressionFormat = uVar15;
  uVar16 = '0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xbf].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xc0].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xc1].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xc2].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xc3].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xc4].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xc5].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xc6].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\x11';
  uVar16 = '\x11';
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar16 = '\n', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) != 0)) {
    uVar16 = '\n';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[199].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\n', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\0', ((ulong)aVar2 & 0x400000000) != 0)))) {
    uVar15 = '\n';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[200].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar16 = '\x11';
  uVar15 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\n', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\0', ((ulong)aVar2 & 0x400000000) != 0)))) {
    uVar15 = '\n';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xc9].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar16 = '\n', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) != 0)) {
    uVar16 = '\n';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xca].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x11';
  uVar15 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\n', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\0', ((ulong)aVar2 & 0x400000000) != 0)))) {
    uVar15 = '\n';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xcb].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\n', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) != 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xcc].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\x11';
  uVar16 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\n', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) != 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xcd].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\n', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) != 0) * '\t' + '\x01';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xce].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar16 = '\x11';
  uVar15 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\n', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\n', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar15 = '\0';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xcf].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = '0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xd0].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xd1].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xd2].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xd3].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xd4].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xd5].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xd6].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xd7].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xd8].
  CompressionFormat.CompressionFormat = uVar15;
  uVar15 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar15 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xd9].
  CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x05', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xda].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\t', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '\t', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar16 = '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xdb].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xdc].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xdd].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x03';
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar16 = '#', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '#';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xde].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\v';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = ',', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar16 = ',';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xdf].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\f';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '-', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar16 = '-';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xe0].
  CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\r';
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar16 = '+', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '+';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xe1].
  CompressionFormat.CompressionFormat = uVar16;
  uVar15 = '\0';
  bVar14 = 0;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xe2].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xe3].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xe4].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xe5].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xe6].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xe7].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xe8].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xe9].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xea].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xeb].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xec].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xed].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xee].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xef].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xf0].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xf1].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xf2].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xf3].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xf4].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xf5].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xf6].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xf7].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xf8].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xf9].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xfa].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xfb].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xfc].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xfd].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xfe].
  CompressionFormat.CompressionFormat = uVar16;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar6 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar6 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0xff].
  CompressionFormat.CompressionFormat = uVar6;
  uVar6 = '0';
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x100]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x101]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x102]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x103]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x104]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x105]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x106]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x107]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x108]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x109]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x10a]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x10b]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x10c]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x10d]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x10e]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x10f]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x110]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x111]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x112]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x113]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x114]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x115]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x116]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x117]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x118]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x119]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x11a]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x11b]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x11c]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x11d]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x11e]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x11f]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x120]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x121]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x122]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x123]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x124]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x125]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x126]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x127]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x128]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x129]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x12a]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\t';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = ')', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = ')', ((ulong)aVar2 & 0x400000000) != 0)))) {
    uVar16 = '\x02';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[299].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[300].
  CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x12d]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x12e]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x12f]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x130]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x131]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x132]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x133]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (bVar14 = 2, ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x134]
  .CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x135]
  .CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x136]
  .CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x137]
  .CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x138]
  .CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x139]
  .CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x13a]
  .CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  bVar14 = 0;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (bVar14 = 2, ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x13b]
  .CompressionFormat.CompressionFormat = bVar14;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = uVar6;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x13c]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x10';
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      uVar16 = '\0';
    }
    else {
      uVar16 = '\x05';
      if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\x14', ((ulong)aVar2 & 0x400000000) != 0))
      {
        uVar16 = '\x05';
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x13d]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\x11';
  uVar16 = '\x11';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '\x05', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '\x11';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x13e]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x05', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\b' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x13f]
  .CompressionFormat.CompressionFormat = uVar15;
  bVar14 = 0;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x140]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x141]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (bVar14 = 2, ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x142]
  .CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x143]
  .CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x144]
  .CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  if (((ulong)aVar2 & 0x442020000) == 0x20000) {
    bVar14 = 0;
  }
  else {
    bVar14 = 2;
    if ((((ulong)aVar2 & 0x442000000) != 0x2000000) &&
       (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
      bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x145]
  .CompressionFormat.CompressionFormat = bVar14;
  aVar2 = *paVar29;
  bVar14 = 0;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (bVar14 = 2, ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (bVar14 = 0xf, (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    bVar14 = (((ulong)aVar2 & 0x400000000) == 0) << 4 | 0xf;
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x146]
  .CompressionFormat.CompressionFormat = bVar14;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x147]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x148]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x149]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x14a]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x14b]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x14c]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x14d]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x14e]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = uVar6;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x14f]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = uVar6;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x150]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x151]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x152]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x153]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x154]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x155]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x156]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x157]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x158]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x159]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x15a]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x15b]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x15c]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x15d]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x15e]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar15 = '\0';
  uVar16 = '0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = uVar15;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x15f]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\a';
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar16 = '\'', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar16 = '\x05', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x05', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\'';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x160]
  .CompressionFormat.CompressionFormat = uVar16;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar15 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x161]
  .CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar16 = '\b';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '(', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\x05', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '(', ((ulong)aVar2 & 0x400000000) != 0)))) {
    uVar16 = '\x05';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x162]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x163]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x18';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) && (uVar16 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0)
     ) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\x03';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x164]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\x11';
  uVar16 = '\x11';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar16 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar16 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x165]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\x01', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     (uVar15 = '\b', (aVar2._0_4_ >> 0x1e & 1) != 0)) {
    uVar15 = (((ulong)aVar2 & 0x400000000) == 0) * '\t' + '\b';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x166]
  .CompressionFormat.CompressionFormat = uVar15;
  uVar16 = '\0';
  uVar15 = '0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar15 = uVar16;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar15 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x167]
  .CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar15 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar15 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar15 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar15 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar15 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x168]
  .CompressionFormat.CompressionFormat = uVar15;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x169]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x16a]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\a';
  uVar16 = '\a';
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar16 = '\'', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar16 = '\x05', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x05', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\'';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x16b]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\'', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\x05', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\x05', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar15 = '\'';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x16c]
  .CompressionFormat.CompressionFormat = uVar15;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x16d]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\x05';
  uVar16 = '\x05';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '\"', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\v', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '\"', ((ulong)aVar2 & 0x400000000) != 0)))) {
    uVar16 = '\v';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x16e]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar15 = '%', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar15 = '\v', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar15 = '\v', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar15 = '%';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x16f]
  .CompressionFormat.CompressionFormat = uVar15;
  aVar2 = *paVar29;
  uVar16 = '\x04';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '$', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\x03', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '\x03', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar16 = '$';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x170]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x06';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '&', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\v', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '\v', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar16 = '&';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x171]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x05';
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar16 = '%', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar16 = '\v', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '%', ((ulong)aVar2 & 0x400000000) != 0)) {
    uVar16 = '\v';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x172]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x06';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '&', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\v', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '\v', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar16 = '&';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x173]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar16 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x174]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = '0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x175]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\v';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '+', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '+', ((ulong)aVar2 & 0x400000000) != 0)))) {
    uVar16 = '\x02';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x176]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\r';
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar16 = '-', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '-', ((ulong)aVar2 & 0x400000000) != 0)) {
    uVar16 = '\x02';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x177]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x03';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = '#', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '#', ((ulong)aVar2 & 0x400000000) != 0)))) {
    uVar16 = '\x02';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x178]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\f';
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar16 = ',', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar16 = '\x02', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar16 = '\x02', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar16 = ',';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x179]
  .CompressionFormat.CompressionFormat = uVar16;
  uVar16 = '\0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) != 0) {
    uVar16 = uVar6;
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar16 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x17a]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar16 = '\x0f';
  if ((((ulong)aVar2 & 0x442020000) != 0x20000) &&
     (uVar16 = '/', ((ulong)aVar2 & 0x442000000) != 0x2000000)) {
    uVar16 = '\0';
    if (((aVar2._0_4_ >> 0x1e & 1) != 0) && (uVar16 = '\0', ((ulong)aVar2 & 0x400000000) == 0)) {
      uVar16 = '/';
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x17b]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  uVar15 = '\a';
  uVar16 = '\a';
  if ((((((ulong)aVar2 & 0x442020000) != 0x20000) &&
       (uVar16 = '\'', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
      (uVar16 = '\x05', (aVar2._0_4_ >> 0x1e & 1) != 0)) &&
     (uVar16 = '\x05', ((ulong)aVar2 & 0x400000000) == 0)) {
    uVar16 = '\'';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x17c]
  .CompressionFormat.CompressionFormat = uVar16;
  aVar2 = *paVar29;
  if (((((ulong)aVar2 & 0x442020000) != 0x20000) &&
      (uVar15 = '\'', ((ulong)aVar2 & 0x442000000) != 0x2000000)) &&
     ((uVar15 = '\x05', (aVar2._0_4_ >> 0x1e & 1) != 0 &&
      (uVar15 = '\x05', ((ulong)aVar2 & 0x400000000) == 0)))) {
    uVar15 = '\'';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x17d]
  .CompressionFormat.CompressionFormat = uVar15;
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar6 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar6 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x17e]
  .CompressionFormat.CompressionFormat = uVar6;
  aVar2 = *paVar29;
  bVar14 = 0x10;
  if (((ulong)aVar2 & 0x442020000) != 0x20000) {
    if (((ulong)aVar2 & 0x442000000) == 0x2000000) {
      bVar14 = 0;
    }
    else {
      bVar14 = 7;
      if ((aVar2._0_4_ >> 0x1e & 1) != 0) {
        bVar14 = (((ulong)aVar2 & 0x400000000) != 0) * '\x03' | 4;
      }
    }
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x17f]
  .CompressionFormat.CompressionFormat = bVar14;
  uVar6 = '0';
  if ((SUB84(*paVar29,0) >> 0x19 & 1) == 0) {
    uVar6 = '\0';
  }
  if (((ulong)*paVar29 & 0x400000000) != 0) {
    uVar6 = '\x10';
  }
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.FormatTable[0x180]
  .CompressionFormat.CompressionFormat = uVar6;
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.SurfaceMaxSize =
       0x100000000000;
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.
  MaxGpuVirtualAddressBitsPerResource = 0x2c;
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.ReconMaxHeight =
       0xc000;
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.ReconMaxWidth =
       0x8000;
  if (0x4b9 < (int)(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.
                   Platform.eProductFamily) {
    (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.HiZPixelsPerByte
         = '\x04';
  }
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TexAlign.Depth.Width = 8;
  (pPVar4->Data).TexAlign.Depth.Height = 4;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TexAlign.Depth_D16_UNORM_1x_4x_16x.Width = 8;
  (pPVar4->Data).TexAlign.Depth_D16_UNORM_1x_4x_16x.Height = 8;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TexAlign.Depth_D16_UNORM_2x_8x.Width = 0x10;
  (pPVar4->Data).TexAlign.Depth_D16_UNORM_2x_8x.Height = 4;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TexAlign.SeparateStencil.Width = 0x10;
  (pPVar4->Data).TexAlign.SeparateStencil.Height = 8;
  pGVar5 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data;
  (pGVar5->TexAlign).CCS.Align.Width = 0x10;
  (pGVar5->TexAlign).CCS.Align.Height = 4;
  *(undefined8 *)
   ((long)&(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.TexAlign.
           CCS.Align + 8) = 0x40000000001;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x49].LogicalTileWidth = 0x80;
  (pPVar4->Data).TileInfo[0x49].LogicalTileHeight = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x49].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x49].LogicalSize = 0x1000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x49].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x49].MaxMipTailStartWidth = 0;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x49].MaxMipTailStartHeight = 0;
  (pPVar4->Data).TileInfo[0x49].MaxMipTailStartDepth = 0;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4e].LogicalTileWidth = 0x1000;
  (pPVar4->Data).TileInfo[0x4e].LogicalTileHeight = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4e].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x4e].LogicalSize = 0x1000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4e].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x4e].MaxMipTailStartWidth = 0x400;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4e].MaxMipTailStartHeight = 1;
  (pPVar4->Data).TileInfo[0x4e].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4d].LogicalTileWidth = 0x2000;
  (pPVar4->Data).TileInfo[0x4d].LogicalTileHeight = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4d].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x4d].LogicalSize = 0x2000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4d].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x4d].MaxMipTailStartWidth = 0x800;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4d].MaxMipTailStartHeight = 1;
  (pPVar4->Data).TileInfo[0x4d].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4c].LogicalTileWidth = 0x4000;
  (pPVar4->Data).TileInfo[0x4c].LogicalTileHeight = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4c].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x4c].LogicalSize = 0x4000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4c].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x4c].MaxMipTailStartWidth = 0x1000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4c].MaxMipTailStartHeight = 1;
  (pPVar4->Data).TileInfo[0x4c].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4b].LogicalTileWidth = 0x8000;
  (pPVar4->Data).TileInfo[0x4b].LogicalTileHeight = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4b].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x4b].LogicalSize = 0x8000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4b].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x4b].MaxMipTailStartWidth = 0x2000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4b].MaxMipTailStartHeight = 1;
  (pPVar4->Data).TileInfo[0x4b].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4a].LogicalTileWidth = 0x10000;
  (pPVar4->Data).TileInfo[0x4a].LogicalTileHeight = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4a].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x4a].LogicalSize = 0x10000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4a].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x4a].MaxMipTailStartWidth = 0x4000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4a].MaxMipTailStartHeight = 1;
  (pPVar4->Data).TileInfo[0x4a].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x53].LogicalTileWidth = 0x400;
  (pPVar4->Data).TileInfo[0x53].LogicalTileHeight = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x53].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x53].LogicalSize = 0x10000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x53].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x53].MaxMipTailStartWidth = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x53].MaxMipTailStartHeight = 0x40;
  (pPVar4->Data).TileInfo[0x53].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x52].LogicalTileWidth = 0x400;
  (pPVar4->Data).TileInfo[0x52].LogicalTileHeight = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x52].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x52].LogicalSize = 0x10000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x52].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x52].MaxMipTailStartWidth = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x52].MaxMipTailStartHeight = 0x40;
  (pPVar4->Data).TileInfo[0x52].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x51].LogicalTileWidth = 0x200;
  (pPVar4->Data).TileInfo[0x51].LogicalTileHeight = 0x80;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x51].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x51].LogicalSize = 0x10000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x51].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x51].MaxMipTailStartWidth = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x51].MaxMipTailStartHeight = 0x80;
  (pPVar4->Data).TileInfo[0x51].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x50].LogicalTileWidth = 0x200;
  (pPVar4->Data).TileInfo[0x50].LogicalTileHeight = 0x80;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x50].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x50].LogicalSize = 0x10000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x50].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x50].MaxMipTailStartWidth = 0x80;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x50].MaxMipTailStartHeight = 0x80;
  (pPVar4->Data).TileInfo[0x50].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4f].LogicalTileWidth = 0x100;
  (pPVar4->Data).TileInfo[0x4f].LogicalTileHeight = 0x100;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4f].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x4f].LogicalSize = 0x10000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4f].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x4f].MaxMipTailStartWidth = 0x80;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x4f].MaxMipTailStartHeight = 0x100;
  (pPVar4->Data).TileInfo[0x4f].MaxMipTailStartDepth = 1;
  aVar2 = *paVar29;
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.TileInfo[0x58].
  LogicalTileWidth = (uint)(((ulong)aVar2 & 0x800000000) >> 0x23) * 0x200 + 0x200;
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.TileInfo[0x58].
  LogicalTileHeight = (uint)(((ulong)aVar2 & 0x800000000) == 0) * 0x20 + 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x58].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x58].LogicalSize = 0x8000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x58].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x58].MaxMipTailStartWidth = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x57].LogicalTileWidth = 0x200;
  (pPVar4->Data).TileInfo[0x57].LogicalTileHeight = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x57].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x57].LogicalSize = 0x8000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x57].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x57].MaxMipTailStartWidth = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x57].MaxMipTailStartHeight = 0x20;
  (pPVar4->Data).TileInfo[0x57].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x56].LogicalTileWidth = 0x100;
  (pPVar4->Data).TileInfo[0x56].LogicalTileHeight = 0x80;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x56].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x56].LogicalSize = 0x8000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x56].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x56].MaxMipTailStartWidth = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x56].MaxMipTailStartHeight = 0x40;
  (pPVar4->Data).TileInfo[0x56].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x55].LogicalTileWidth = 0x100;
  (pPVar4->Data).TileInfo[0x55].LogicalTileHeight = 0x80;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x55].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x55].LogicalSize = 0x8000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x55].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x55].MaxMipTailStartWidth = 0x80;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x55].MaxMipTailStartHeight = 0x40;
  (pPVar4->Data).TileInfo[0x55].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x54].LogicalTileWidth = 0x80;
  (pPVar4->Data).TileInfo[0x54].LogicalTileHeight = 0x100;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x54].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x54].LogicalSize = 0x8000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x54].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x54].MaxMipTailStartWidth = 0x80;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x54].MaxMipTailStartHeight = 0x80;
  (pPVar4->Data).TileInfo[0x54].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5d].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x5d].LogicalSize = 0x4000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5d].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x5d].MaxMipTailStartWidth = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5c].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x5c].LogicalSize = 0x4000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5c].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x5c].MaxMipTailStartWidth = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5c].MaxMipTailStartHeight = 0x20;
  (pPVar4->Data).TileInfo[0x5c].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5d].LogicalTileWidth = 0x200;
  (pPVar4->Data).TileInfo[0x5d].LogicalTileHeight = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5b].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x5b].LogicalSize = 0x4000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5b].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x5b].MaxMipTailStartWidth = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5b].MaxMipTailStartHeight = 0x40;
  (pPVar4->Data).TileInfo[0x5b].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5c].LogicalTileWidth = 0x200;
  (pPVar4->Data).TileInfo[0x5c].LogicalTileHeight = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5a].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x5a].LogicalSize = 0x4000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5a].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x5a].MaxMipTailStartWidth = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5a].MaxMipTailStartHeight = 0x40;
  (pPVar4->Data).TileInfo[0x5a].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5b].LogicalTileWidth = 0x100;
  (pPVar4->Data).TileInfo[0x5b].LogicalTileHeight = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x58].MaxMipTailStartHeight = 0x20;
  (pPVar4->Data).TileInfo[0x58].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x59].LogicalTileWidth = 0x80;
  (pPVar4->Data).TileInfo[0x59].LogicalTileHeight = 0x80;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x59].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x59].LogicalSize = 0x4000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x59].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x59].MaxMipTailStartWidth = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x59].MaxMipTailStartHeight = 0x80;
  (pPVar4->Data).TileInfo[0x59].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5a].LogicalTileWidth = 0x100;
  (pPVar4->Data).TileInfo[0x5a].LogicalTileHeight = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x67].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x67].LogicalSize = 0x2000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x67].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x67].MaxMipTailStartWidth = 8;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x66].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x66].LogicalSize = 0x2000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x66].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x66].MaxMipTailStartWidth = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x66].MaxMipTailStartHeight = 0x20;
  (pPVar4->Data).TileInfo[0x66].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x67].LogicalTileWidth = 0x100;
  (pPVar4->Data).TileInfo[0x67].LogicalTileHeight = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x65].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x65].LogicalSize = 0x2000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x65].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x65].MaxMipTailStartWidth = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x65].MaxMipTailStartHeight = 0x40;
  (pPVar4->Data).TileInfo[0x65].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x66].LogicalTileWidth = 0x100;
  (pPVar4->Data).TileInfo[0x66].LogicalTileHeight = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[100].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[100].LogicalSize = 0x2000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[100].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[100].MaxMipTailStartWidth = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[100].MaxMipTailStartHeight = 0x40;
  (pPVar4->Data).TileInfo[100].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x65].LogicalTileWidth = 0x100;
  (pPVar4->Data).TileInfo[0x65].LogicalTileHeight = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[99].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[99].LogicalSize = 0x2000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[99].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[99].MaxMipTailStartWidth = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[99].MaxMipTailStartHeight = 0x80;
  (pPVar4->Data).TileInfo[99].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[100].LogicalTileWidth = 0x80;
  (pPVar4->Data).TileInfo[100].LogicalTileHeight = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6c].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x6c].LogicalSize = 0x1000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6c].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x6c].MaxMipTailStartWidth = 8;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6c].MaxMipTailStartHeight = 0x10;
  (pPVar4->Data).TileInfo[0x6c].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6b].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x6b].LogicalSize = 0x1000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6b].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x6b].MaxMipTailStartWidth = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6b].MaxMipTailStartHeight = 0x10;
  (pPVar4->Data).TileInfo[0x6b].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6c].LogicalTileWidth = 0x100;
  (pPVar4->Data).TileInfo[0x6c].LogicalTileHeight = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6a].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x6a].LogicalSize = 0x1000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6a].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x6a].MaxMipTailStartWidth = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6a].MaxMipTailStartHeight = 0x20;
  (pPVar4->Data).TileInfo[0x6a].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6b].LogicalTileWidth = 0x80;
  (pPVar4->Data).TileInfo[0x6b].LogicalTileHeight = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x69].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x69].LogicalSize = 0x1000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x69].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x69].MaxMipTailStartWidth = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x69].MaxMipTailStartHeight = 0x20;
  (pPVar4->Data).TileInfo[0x69].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x6a].LogicalTileWidth = 0x80;
  (pPVar4->Data).TileInfo[0x6a].LogicalTileHeight = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x67].MaxMipTailStartHeight = 0x20;
  (pPVar4->Data).TileInfo[0x67].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x68].LogicalTileWidth = 0x40;
  (pPVar4->Data).TileInfo[0x68].LogicalTileHeight = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x68].LogicalTileDepth = 1;
  (pPVar4->Data).TileInfo[0x68].LogicalSize = 0x1000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x68].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x68].MaxMipTailStartWidth = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x68].MaxMipTailStartHeight = 0x40;
  (pPVar4->Data).TileInfo[0x68].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x69].LogicalTileWidth = 0x80;
  (pPVar4->Data).TileInfo[0x69].LogicalTileHeight = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x62].LogicalTileDepth = 0x10;
  (pPVar4->Data).TileInfo[0x62].LogicalSize = 0x10000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x62].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x62].MaxMipTailStartWidth = 8;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x62].MaxMipTailStartHeight = 0x10;
  (pPVar4->Data).TileInfo[0x62].MaxMipTailStartDepth = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[99].LogicalTileWidth = 0x80;
  (pPVar4->Data).TileInfo[99].LogicalTileHeight = 0x40;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x61].LogicalTileDepth = 0x10;
  (pPVar4->Data).TileInfo[0x61].LogicalSize = 0x10000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x61].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x61].MaxMipTailStartWidth = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x61].MaxMipTailStartHeight = 0x10;
  (pPVar4->Data).TileInfo[0x61].MaxMipTailStartDepth = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x62].LogicalTileWidth = 0x100;
  (pPVar4->Data).TileInfo[0x62].LogicalTileHeight = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x60].LogicalTileDepth = 0x10;
  (pPVar4->Data).TileInfo[0x60].LogicalSize = 0x10000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x60].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x60].MaxMipTailStartWidth = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x60].MaxMipTailStartHeight = 0x20;
  (pPVar4->Data).TileInfo[0x60].MaxMipTailStartDepth = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x61].LogicalTileWidth = 0x100;
  (pPVar4->Data).TileInfo[0x61].LogicalTileHeight = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5f].LogicalTileDepth = 0x20;
  (pPVar4->Data).TileInfo[0x5f].LogicalSize = 0x10000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5f].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x5f].MaxMipTailStartWidth = 0x10;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5f].MaxMipTailStartHeight = 0x20;
  (pPVar4->Data).TileInfo[0x5f].MaxMipTailStartDepth = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x60].LogicalTileWidth = 0x80;
  (pPVar4->Data).TileInfo[0x60].LogicalTileHeight = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5d].MaxMipTailStartHeight = 0x20;
  (pPVar4->Data).TileInfo[0x5d].MaxMipTailStartDepth = 1;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5e].LogicalTileWidth = 0x40;
  (pPVar4->Data).TileInfo[0x5e].LogicalTileHeight = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5e].LogicalTileDepth = 0x20;
  (pPVar4->Data).TileInfo[0x5e].LogicalSize = 0x10000;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5e].MaxPitch = 0x40000;
  (pPVar4->Data).TileInfo[0x5e].MaxMipTailStartWidth = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5e].MaxMipTailStartHeight = 0x20;
  (pPVar4->Data).TileInfo[0x5e].MaxMipTailStartDepth = 0x20;
  pPVar4 = &(this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo;
  (pPVar4->Data).TileInfo[0x5f].LogicalTileWidth = 0x40;
  (pPVar4->Data).TileInfo[0x5f].LogicalTileHeight = 0x20;
  (this->TexAlignEx).CCSEx[0].Align.Width = 0x100;
  (this->TexAlignEx).CCSEx[0].Align.Height = 0x40;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0].Align.Depth = 0x1000000001;
  (this->TexAlignEx).CCSEx[0].Downscale.Height = 0x10;
  (this->TexAlignEx).CCSEx[0].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[1].Align.Width = 0x100;
  (this->TexAlignEx).CCSEx[1].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[1].Align.Depth = 0x1000000001;
  (this->TexAlignEx).CCSEx[1].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[1].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[2].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[2].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[2].Align.Depth = 0x800000001;
  (this->TexAlignEx).CCSEx[2].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[2].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[3].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[3].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[3].Align.Depth = 0x800000001;
  (this->TexAlignEx).CCSEx[3].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[3].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[4].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[4].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[4].Align.Depth = 0x400000001;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x19].Align.Depth = 0x400000010;
  (this->TexAlignEx).CCSEx[0x19].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0x19].Downscale.Depth = 0x10;
  (this->TexAlignEx).CCSEx[0x1a].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x1a].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x1a].Align.Depth = 0x200000010;
  (this->TexAlignEx).CCSEx[0x1a].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0x1a].Downscale.Depth = 0x10;
  (this->TexAlignEx).CCSEx[0x1b].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x1b].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x1b].Align.Depth = 0x200000008;
  (this->TexAlignEx).CCSEx[0x1b].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0x1b].Downscale.Depth = 8;
  (this->TexAlignEx).CCSEx[0x1c].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x1c].Align.Height = 8;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x1c].Align.Depth = 0x200000008;
  (this->TexAlignEx).CCSEx[0x1c].Downscale.Height = 2;
  (this->TexAlignEx).CCSEx[0x1c].Downscale.Depth = 8;
  (this->TexAlignEx).CCSEx[0x1d].Align.Width = 0x10;
  (this->TexAlignEx).CCSEx[0x1d].Align.Height = 8;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x1d].Align.Depth = 0x100000008;
  (this->TexAlignEx).CCSEx[0x1d].Downscale.Height = 2;
  (this->TexAlignEx).CCSEx[0x1d].Downscale.Depth = 8;
  (this->TexAlignEx).CCSEx[4].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[4].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[5].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[5].Align.Height = 0x40;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[5].Align.Depth = 0x800000002;
  (this->TexAlignEx).CCSEx[5].Downscale.Height = 0x10;
  (this->TexAlignEx).CCSEx[5].Downscale.Depth = 2;
  (this->TexAlignEx).CCSEx[6].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[6].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[6].Align.Depth = 0x800000002;
  (this->TexAlignEx).CCSEx[6].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[6].Downscale.Depth = 2;
  (this->TexAlignEx).CCSEx[7].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[7].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[7].Align.Depth = 0x400000002;
  (this->TexAlignEx).CCSEx[7].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[7].Downscale.Depth = 2;
  (this->TexAlignEx).CCSEx[8].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[8].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[8].Align.Depth = 0x400000002;
  (this->TexAlignEx).CCSEx[8].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[8].Downscale.Depth = 2;
  (this->TexAlignEx).CCSEx[9].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[9].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[9].Align.Depth = 0x200000002;
  (this->TexAlignEx).CCSEx[9].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[9].Downscale.Depth = 2;
  (this->TexAlignEx).CCSEx[10].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[10].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[10].Align.Depth = 0x800000004;
  (this->TexAlignEx).CCSEx[10].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[10].Downscale.Depth = 4;
  (this->TexAlignEx).CCSEx[0xb].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[0xb].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0xb].Align.Depth = 0x800000004;
  (this->TexAlignEx).CCSEx[0xb].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0xb].Downscale.Depth = 4;
  (this->TexAlignEx).CCSEx[0xc].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0xc].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0xc].Align.Depth = 0x400000004;
  (this->TexAlignEx).CCSEx[0xc].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0xc].Downscale.Depth = 4;
  (this->TexAlignEx).CCSEx[0xd].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0xd].Align.Height = 8;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0xd].Align.Depth = 0x400000004;
  (this->TexAlignEx).CCSEx[0xd].Downscale.Height = 2;
  (this->TexAlignEx).CCSEx[0xd].Downscale.Depth = 4;
  (this->TexAlignEx).CCSEx[0xe].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0xe].Align.Height = 8;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0xe].Align.Depth = 0x200000004;
  (this->TexAlignEx).CCSEx[0xe].Downscale.Height = 2;
  (this->TexAlignEx).CCSEx[0xe].Downscale.Depth = 4;
  (this->TexAlignEx).CCSEx[0xf].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0xf].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0xf].Align.Depth = 0x400000008;
  (this->TexAlignEx).CCSEx[0xf].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[0xf].Downscale.Depth = 8;
  (this->TexAlignEx).CCSEx[0x10].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x10].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x10].Align.Depth = 0x400000008;
  (this->TexAlignEx).CCSEx[0x10].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0x10].Downscale.Depth = 8;
  (this->TexAlignEx).CCSEx[0x11].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x11].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x11].Align.Depth = 0x200000008;
  (this->TexAlignEx).CCSEx[0x11].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0x11].Downscale.Depth = 8;
  (this->TexAlignEx).CCSEx[0x12].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x12].Align.Height = 8;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x12].Align.Depth = 0x200000008;
  (this->TexAlignEx).CCSEx[0x12].Downscale.Height = 2;
  (this->TexAlignEx).CCSEx[0x12].Downscale.Depth = 8;
  (this->TexAlignEx).CCSEx[0x13].Align.Width = 0x10;
  (this->TexAlignEx).CCSEx[0x13].Align.Height = 8;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x13].Align.Depth = 0x100000008;
  (this->TexAlignEx).CCSEx[0x13].Downscale.Height = 2;
  (this->TexAlignEx).CCSEx[0x13].Downscale.Depth = 8;
  (this->TexAlignEx).CCSEx[0x14].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x14].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x14].Align.Depth = 0x400000010;
  (this->TexAlignEx).CCSEx[0x14].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0x14].Downscale.Depth = 0x10;
  (this->TexAlignEx).CCSEx[0x15].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x15].Align.Height = 8;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x15].Align.Depth = 0x400000010;
  (this->TexAlignEx).CCSEx[0x15].Downscale.Height = 2;
  (this->TexAlignEx).CCSEx[0x15].Downscale.Depth = 0x10;
  (this->TexAlignEx).CCSEx[0x16].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x16].Align.Height = 8;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x16].Align.Depth = 0x200000010;
  (this->TexAlignEx).CCSEx[0x16].Downscale.Height = 2;
  (this->TexAlignEx).CCSEx[0x16].Downscale.Depth = 0x10;
  (this->TexAlignEx).CCSEx[0x17].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x17].Align.Height = 4;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x17].Align.Depth = 0x200000010;
  (this->TexAlignEx).CCSEx[0x17].Downscale.Height = 1;
  (this->TexAlignEx).CCSEx[0x17].Downscale.Depth = 0x10;
  (this->TexAlignEx).CCSEx[0x18].Align.Width = 0x10;
  (this->TexAlignEx).CCSEx[0x18].Align.Height = 4;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x18].Align.Depth = 0x100000010;
  (this->TexAlignEx).CCSEx[0x18].Downscale.Height = 1;
  (this->TexAlignEx).CCSEx[0x18].Downscale.Depth = 0x10;
  (this->TexAlignEx).CCSEx[0x19].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x19].Align.Height = 0x10;
  (this->TexAlignEx).CCSEx[0x1e].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[0x1e].Align.Height = 0x80;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x1e].Align.Depth = 0x800000001;
  (this->TexAlignEx).CCSEx[0x1e].Downscale.Height = 0x20;
  (this->TexAlignEx).CCSEx[0x1e].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x1f].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[0x1f].Align.Height = 0x40;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x1f].Align.Depth = 0x800000001;
  (this->TexAlignEx).CCSEx[0x1f].Downscale.Height = 0x10;
  (this->TexAlignEx).CCSEx[0x1f].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x20].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x20].Align.Height = 0x40;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x20].Align.Depth = 0x400000001;
  (this->TexAlignEx).CCSEx[0x20].Downscale.Height = 0x10;
  (this->TexAlignEx).CCSEx[0x20].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x21].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x21].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x21].Align.Depth = 0x400000001;
  (this->TexAlignEx).CCSEx[0x21].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[0x21].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x22].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x22].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x22].Align.Depth = 0x200000001;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x37].Align.Depth = 0x200000020;
  (this->TexAlignEx).CCSEx[0x37].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0x37].Downscale.Depth = 0x20;
  (this->TexAlignEx).CCSEx[0x38].Align.Width = 0x10;
  (this->TexAlignEx).CCSEx[0x38].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x38].Align.Depth = 0x100000020;
  (this->TexAlignEx).CCSEx[0x38].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0x38].Downscale.Depth = 0x20;
  (this->TexAlignEx).CCSEx[0x39].Align.Width = 0x10;
  (this->TexAlignEx).CCSEx[0x39].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x39].Align.Depth = 0x100000010;
  (this->TexAlignEx).CCSEx[0x39].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0x39].Downscale.Depth = 0x10;
  (this->TexAlignEx).CCSEx[0x3a].Align.Width = 0x10;
  (this->TexAlignEx).CCSEx[0x3a].Align.Height = 8;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x3a].Align.Depth = 0x100000010;
  (this->TexAlignEx).CCSEx[0x3a].Downscale.Height = 2;
  (this->TexAlignEx).CCSEx[0x3a].Downscale.Depth = 0x10;
  (this->TexAlignEx).CCSEx[0x3b].Align.Width = 8;
  (this->TexAlignEx).CCSEx[0x3b].Align.Height = 8;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x3b].Align.Depth = 0xfffffffe00000010;
  (this->TexAlignEx).CCSEx[0x3b].Downscale.Height = 2;
  (this->TexAlignEx).CCSEx[0x3b].Downscale.Depth = 0x10;
  (this->TexAlignEx).CCSEx[0x22].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[0x22].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x23].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[0x23].Align.Height = 0x80;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x23].Align.Depth = 0x800000001;
  (this->TexAlignEx).CCSEx[0x23].Downscale.Height = 0x20;
  (this->TexAlignEx).CCSEx[0x23].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x24].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[0x24].Align.Height = 0x40;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x24].Align.Depth = 0x800000001;
  (this->TexAlignEx).CCSEx[0x24].Downscale.Height = 0x10;
  (this->TexAlignEx).CCSEx[0x24].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x25].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x25].Align.Height = 0x40;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x25].Align.Depth = 0x400000001;
  (this->TexAlignEx).CCSEx[0x25].Downscale.Height = 0x10;
  (this->TexAlignEx).CCSEx[0x25].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x26].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x26].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x26].Align.Depth = 0x400000001;
  (this->TexAlignEx).CCSEx[0x26].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[0x26].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x27].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x27].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x27].Align.Depth = 0x200000001;
  (this->TexAlignEx).CCSEx[0x27].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[0x27].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x28].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[0x28].Align.Height = 0x80;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x28].Align.Depth = 0x800000001;
  (this->TexAlignEx).CCSEx[0x28].Downscale.Height = 0x20;
  (this->TexAlignEx).CCSEx[0x28].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x29].Align.Width = 0x80;
  (this->TexAlignEx).CCSEx[0x29].Align.Height = 0x40;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x29].Align.Depth = 0x800000001;
  (this->TexAlignEx).CCSEx[0x29].Downscale.Height = 0x10;
  (this->TexAlignEx).CCSEx[0x29].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x2a].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x2a].Align.Height = 0x40;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x2a].Align.Depth = 0x400000001;
  (this->TexAlignEx).CCSEx[0x2a].Downscale.Height = 0x10;
  (this->TexAlignEx).CCSEx[0x2a].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x2b].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x2b].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x2b].Align.Depth = 0x400000001;
  (this->TexAlignEx).CCSEx[0x2b].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[0x2b].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x2c].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x2c].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x2c].Align.Depth = 0x200000001;
  (this->TexAlignEx).CCSEx[0x2c].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[0x2c].Downscale.Depth = 1;
  (this->TexAlignEx).CCSEx[0x2d].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x2d].Align.Height = 0x80;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x2d].Align.Depth = 0x400000002;
  (this->TexAlignEx).CCSEx[0x2d].Downscale.Height = 0x20;
  (this->TexAlignEx).CCSEx[0x2d].Downscale.Depth = 2;
  (this->TexAlignEx).CCSEx[0x2e].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x2e].Align.Height = 0x40;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x2e].Align.Depth = 0x400000002;
  (this->TexAlignEx).CCSEx[0x2e].Downscale.Height = 0x10;
  (this->TexAlignEx).CCSEx[0x2e].Downscale.Depth = 2;
  (this->TexAlignEx).CCSEx[0x2f].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x2f].Align.Height = 0x40;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x2f].Align.Depth = 0x200000002;
  (this->TexAlignEx).CCSEx[0x2f].Downscale.Height = 0x10;
  (this->TexAlignEx).CCSEx[0x2f].Downscale.Depth = 2;
  (this->TexAlignEx).CCSEx[0x30].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x30].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x30].Align.Depth = 0x200000002;
  (this->TexAlignEx).CCSEx[0x30].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[0x30].Downscale.Depth = 2;
  (this->TexAlignEx).CCSEx[0x31].Align.Width = 0x10;
  (this->TexAlignEx).CCSEx[0x31].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x31].Align.Depth = 0x100000002;
  (this->TexAlignEx).CCSEx[0x31].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[0x31].Downscale.Depth = 2;
  (this->TexAlignEx).CCSEx[0x32].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x32].Align.Height = 0x40;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x32].Align.Depth = 0x400000004;
  (this->TexAlignEx).CCSEx[0x32].Downscale.Height = 0x10;
  (this->TexAlignEx).CCSEx[0x32].Downscale.Depth = 4;
  (this->TexAlignEx).CCSEx[0x33].Align.Width = 0x40;
  (this->TexAlignEx).CCSEx[0x33].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x33].Align.Depth = 0x400000004;
  (this->TexAlignEx).CCSEx[0x33].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[0x33].Downscale.Depth = 4;
  (this->TexAlignEx).CCSEx[0x34].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x34].Align.Height = 0x20;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x34].Align.Depth = 0x200000004;
  (this->TexAlignEx).CCSEx[0x34].Downscale.Height = 8;
  (this->TexAlignEx).CCSEx[0x34].Downscale.Depth = 4;
  (this->TexAlignEx).CCSEx[0x35].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x35].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x35].Align.Depth = 0x200000004;
  (this->TexAlignEx).CCSEx[0x35].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0x35].Downscale.Depth = 4;
  (this->TexAlignEx).CCSEx[0x36].Align.Width = 0x10;
  (this->TexAlignEx).CCSEx[0x36].Align.Height = 0x10;
  *(undefined8 *)&(this->TexAlignEx).CCSEx[0x36].Align.Depth = 0x100000004;
  (this->TexAlignEx).CCSEx[0x36].Downscale.Height = 4;
  (this->TexAlignEx).CCSEx[0x36].Downscale.Depth = 4;
  (this->TexAlignEx).CCSEx[0x37].Align.Width = 0x20;
  (this->TexAlignEx).CCSEx[0x37].Align.Height = 0x10;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 - 3].Align.Width = 0x200;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 - 3].Align.Height = 0x20;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 - 3].Align.Depth = 1;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 - 3].Downscale.Width = 0x100;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 - 3].Downscale.Height = 0x10;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 - 3].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 - 3].Align.Width = 0x100;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 - 3].Align.Height = 0x20;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 - 3].Align.Depth = 1;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 - 3].Downscale.Width = 0x80;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 - 3].Downscale.Height = 0x10;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 - 3].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 - 3].Align.Width = 0x80;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 - 3].Align.Height = 0x20;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 - 3].Align.Depth = 1;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 - 3].Downscale.Width = 0x40;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 - 3].Downscale.Height = 0x10;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 - 3].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 - 3].Align.Width = 0x40;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 - 3].Align.Height = 0x20;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 - 3].Align.Depth = 1;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 - 3].Downscale.Width = 0x20;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 - 3].Downscale.Height = 0x10;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 - 3].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 - 3].Align.Width = 0x20;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 - 3].Align.Height = 0x20;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 - 3].Align.Depth = 1;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 - 3].Downscale.Width = 0x10;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 - 3].Downscale.Height = 0x10;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 - 3].Downscale.Depth = 1;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 2].Align.Width = 0x100;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 2].Align.Height = 0x40;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 2].Align.Depth = 1;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 2].Downscale.Width = 0x80;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 2].Downscale.Height = 0x20;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 2].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 2].Align.Width = 0x100;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 2].Align.Height = 0x20;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 2].Align.Depth = 1;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 2].Downscale.Width = 0x80;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 2].Downscale.Height = 0x10;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 2].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 2].Align.Width = 0x80;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 2].Align.Height = 0x20;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 2].Align.Depth = 1;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 2].Downscale.Width = 0x40;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 2].Downscale.Height = 0x10;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 2].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 2].Align.Width = 0x80;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 2].Align.Height = 0x10;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 2].Align.Depth = 1;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 2].Downscale.Width = 0x40;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 2].Downscale.Height = 8;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 2].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 2].Align.Width = 0x40;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 2].Align.Height = 0x10;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 2].Align.Depth = 1;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 2].Downscale.Width = 0x20;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 2].Downscale.Height = 8;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 2].Downscale.Depth = 1;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 7].Align.Width = 0x80;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 7].Align.Height = 0x80;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 7].Align.Depth = 1;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 7].Downscale.Width = 0x40;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 7].Downscale.Height = 0x40;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 7].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 7].Align.Width = 0x80;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 7].Align.Height = 0x40;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 7].Align.Depth = 1;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 7].Downscale.Width = 0x40;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 7].Downscale.Height = 0x20;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 7].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 7].Align.Width = 0x40;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 7].Align.Height = 0x40;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 7].Align.Depth = 1;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 7].Downscale.Width = 0x20;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 7].Downscale.Height = 0x20;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 7].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 7].Align.Width = 0x40;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 7].Align.Height = 0x20;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 7].Align.Depth = 1;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 7].Downscale.Width = 0x20;
  uVar7 = __GmmLog2(0x40);
  uVar9 = 0x10;
  this->FCTileMode[uVar7 + 7].Downscale.Height = 0x10;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 7].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 7].Align.Width = 0x20;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 7].Align.Height = 0x20;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 7].Align.Depth = 1;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 7].Downscale.Width = 0x10;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 7].Downscale.Height = 0x10;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 7].Downscale.Depth = 1;
  bVar30 = ((ulong)*paVar29 & 0x400000000) == 0;
  uVar7 = 0x400;
  if (!bVar30) {
    uVar7 = 0x40;
  }
  uVar22 = 4;
  uVar28 = uVar22;
  if (bVar30) {
    uVar28 = uVar9;
  }
  uVar17 = 0x200;
  if (!bVar30) {
    uVar17 = 0x20;
  }
  uVar18 = 0x100;
  if (!bVar30) {
    uVar18 = uVar9;
  }
  uVar12 = 8;
  uVar25 = uVar22;
  uVar24 = uVar12;
  uVar3 = uVar22;
  if (bVar30) {
    uVar24 = 0x80;
    uVar25 = 0x80;
    uVar3 = 0x40;
  }
  uVar13 = 0x20;
  uVar26 = uVar13;
  if (bVar30) {
    uVar26 = 0x80;
  }
  uVar21 = 0x40;
  uVar20 = uVar12;
  uVar19 = uVar9;
  if (bVar30) {
    uVar19 = 0x40;
    uVar20 = 0x40;
    uVar21 = 1;
    uVar22 = uVar13;
  }
  if (bVar30) {
    uVar13 = 1;
  }
  iVar8 = (uint)!bVar30 * 3 + 1;
  if (bVar30) {
    uVar9 = 1;
    uVar12 = 1;
  }
  uVar27 = (uint)bVar30 * 0x40 + 0x40;
  uVar10 = __GmmLog2(8);
  this->FCTileMode[uVar10 + 0xc].Align.Width = uVar7;
  uVar10 = __GmmLog2(8);
  this->FCTileMode[uVar10 + 0xc].Align.Height = uVar28;
  uVar10 = __GmmLog2(8);
  this->FCTileMode[uVar10 + 0xc].Align.Depth = 1;
  uVar10 = __GmmLog2(8);
  this->FCTileMode[uVar10 + 0xc].Downscale.Width = uVar7;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0xc].Downscale.Height = uVar28;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0xc].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0xc].Align.Width = uVar17;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0xc].Align.Height = uVar28;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0xc].Align.Depth = 1;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0xc].Downscale.Width = uVar17;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0xc].Downscale.Height = uVar28;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0xc].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0xc].Align.Width = uVar18;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0xc].Align.Height = uVar28;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0xc].Align.Depth = 1;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0xc].Downscale.Width = uVar18;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0xc].Downscale.Height = uVar28;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0xc].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0xc].Align.Width = uVar24;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0xc].Align.Height = uVar28;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0xc].Align.Depth = 1;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0xc].Downscale.Width = uVar24;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0xc].Downscale.Height = uVar28;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0xc].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0xc].Align.Width = uVar3;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0xc].Align.Height = uVar28;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0xc].Align.Depth = 1;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0xc].Downscale.Width = uVar3;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0xc].Downscale.Height = uVar28;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0xc].Downscale.Depth = 1;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x11].Align.Width = uVar27;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x11].Align.Height = uVar25;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x11].Align.Depth = 1;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x11].Downscale.Width = uVar27;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x11].Downscale.Height = uVar25;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x11].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x11].Align.Width = uVar26;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x11].Align.Height = uVar3;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x11].Align.Depth = 1;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x11].Downscale.Width = uVar26;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x11].Downscale.Height = uVar3;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x11].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x11].Align.Width = uVar19;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x11].Align.Height = uVar3;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x11].Align.Depth = 1;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x11].Downscale.Width = uVar19;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x11].Downscale.Height = uVar3;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x11].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x11].Align.Width = uVar20;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x11].Align.Height = uVar22;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x11].Align.Depth = 1;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x11].Downscale.Width = uVar20;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x11].Downscale.Height = uVar22;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x11].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x11].Align.Width = uVar22;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x11].Align.Height = uVar22;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x11].Align.Depth = 1;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x11].Downscale.Width = uVar22;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x11].Downscale.Height = uVar22;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x11].Downscale.Depth = 1;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x16].Align.Width = uVar21;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x16].Align.Height = uVar13;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x16].Align.Depth = uVar13;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x16].Downscale.Width = iVar8;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x16].Downscale.Height = uVar12;
  uVar7 = __GmmLog2(8);
  this->FCTileMode[uVar7 + 0x16].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x16].Align.Width = uVar13;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x16].Align.Height = uVar13;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x16].Align.Depth = uVar13;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x16].Downscale.Width = uVar12;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x16].Downscale.Height = iVar8;
  uVar7 = __GmmLog2(0x10);
  this->FCTileMode[uVar7 + 0x16].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x16].Align.Width = uVar13;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x16].Align.Height = uVar13;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x16].Align.Depth = uVar9;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x16].Downscale.Width = iVar8;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x16].Downscale.Height = iVar8;
  uVar7 = __GmmLog2(0x20);
  this->FCTileMode[uVar7 + 0x16].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x16].Align.Width = uVar13;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x16].Align.Height = uVar9;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x16].Align.Depth = uVar9;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x16].Downscale.Width = iVar8;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x16].Downscale.Height = iVar8;
  uVar7 = __GmmLog2(0x40);
  this->FCTileMode[uVar7 + 0x16].Downscale.Depth = 1;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x16].Align.Width = uVar9;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x16].Align.Height = uVar9;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x16].Align.Depth = uVar9;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x16].Downscale.Width = iVar8;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x16].Downscale.Height = iVar8;
  uVar7 = __GmmLog2(0x80);
  this->FCTileMode[uVar7 + 0x16].Downscale.Depth = 1;
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.NoOfBitsSupported
       = '\'';
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.
  HighestAcceptablePhysicalAddress = 0x7fffffffff;
  PVar1 = (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.Platform.
          eProductFamily;
  if (0x4f9 < (int)PVar1) {
    (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.
    NoOfBitsSupported = '4';
    (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.
    HighestAcceptablePhysicalAddress = 0xfffffffffffff;
  }
  if (2 < PVar1 - IGFX_ALDERLAKE_S) {
    if (PVar1 == IGFX_PVC) {
      uVar11 = 0xfffffffffffff;
      uVar6 = '4';
      goto LAB_0019ba98;
    }
    if ((int)PVar1 < 0x4e2) {
      return;
    }
  }
  uVar11 = 0x3fffffffffff;
  uVar6 = '.';
LAB_0019ba98:
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.NoOfBitsSupported
       = uVar6;
  (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.
  HighestAcceptablePhysicalAddress = uVar11;
  return;
}

Assistant:

GmmLib::PlatformInfoGen12::PlatformInfoGen12(PLATFORM &Platform, Context *pGmmLibContext)
    : PlatformInfoGen11(Platform, pGmmLibContext)
{
    __GMM_ASSERTPTR(pGmmLibContext, VOIDRETURN);

    //Compression format update
    GMM_RESOURCE_FORMAT GmmFormat;
#define GMM_FORMAT_SKU(FtrXxx) (pGmmLibContext->GetSkuTable().FtrXxx != 0)
#define GMM_FORMAT(Name, bpe, _Width, _Height, _Depth, IsRT, IsASTC, RcsSurfaceFormat, SSCompressionFmt, Availability) \
                                                                                                                       \
    {                                                                                                                  \
        GmmFormat                                                       = GMM_FORMAT_##Name;                           \
        Data.FormatTable[GmmFormat].CompressionFormat.CompressionFormat = static_cast<uint8_t>(SSCompressionFmt);      \
    }

#include "External/Common/GmmFormatTable.h"


    // --------------------------
    // Surface Alignment Units
    // --------------------------

    // 3DSTATE_DEPTH_BUFFER
    //======================================================================
    //   Surf Format       |     MSAA         |     HAlign    |   VAlign   |
    //======================================================================
    //     D16_UNORM       |    1x, 4x, 16x   |       8       |      8     |
    //     D16_UNORM       |      2x, 8x      |      16       |      4     |
    // Not D16_UNORM       |  1x,2x,4x,8x,16x |       8       |      4     |
    //======================================================================


    // 3DSTATE_STENCIL_BUFFER
    //======================================================================
    //   Surf Format       |     MSAA         |     HAlign    |   VAlign   |
    //======================================================================
    //       N/A           |       N/A        |      16       |      8     |
    //======================================================================

    Data.SurfaceMaxSize                      = GMM_GBYTE(16384);
    Data.MaxGpuVirtualAddressBitsPerResource = 44;

    //Override the Height VP9 VdEnc requirement for Gen12 16k resolution.
    Data.ReconMaxHeight = GMM_KBYTE(48);
    Data.ReconMaxWidth  = GMM_KBYTE(32);

    if((GFX_GET_CURRENT_PRODUCT(Data.Platform) >= IGFX_DG1))
    {
        Data.HiZPixelsPerByte = 4;
    }

    Data.TexAlign.Depth.Width                      = 8; // Not D16_UNORM
    Data.TexAlign.Depth.Height                     = 4;
    Data.TexAlign.Depth_D16_UNORM_1x_4x_16x.Width  = 8;
    Data.TexAlign.Depth_D16_UNORM_1x_4x_16x.Height = 8;
    Data.TexAlign.Depth_D16_UNORM_2x_8x.Width      = 16;
    Data.TexAlign.Depth_D16_UNORM_2x_8x.Height     = 4;
    Data.TexAlign.SeparateStencil.Width            = 16;
    Data.TexAlign.SeparateStencil.Height           = 8;

    //CCS unit size ie cacheline
    Data.TexAlign.CCS.Align.Width     = 16;
    Data.TexAlign.CCS.Align.Height    = 4;
    Data.TexAlign.CCS.Align.Depth     = 1;
    Data.TexAlign.CCS.MaxPitchinTiles = 1024;

    // clang-format off
    SET_TILE_MODE_INFO(TILE4,                        128,       32,        1,         0,         0,         0)

    // TILE__64 1D
    SET_TILE_MODE_INFO(TILE__64_1D_128bpe,       4096,        1,        1,      1024,         1,         1)
    SET_TILE_MODE_INFO(TILE__64_1D_64bpe,        8192,        1,        1,      2048,         1,         1)
    SET_TILE_MODE_INFO(TILE__64_1D_32bpe,       16384,        1,        1,      4096,         1,         1)
    SET_TILE_MODE_INFO(TILE__64_1D_16bpe,       32768,        1,        1,      8192,         1,         1)
    SET_TILE_MODE_INFO(TILE__64_1D_8bpe,        65536,        1,        1,     16384,         1,         1)

    // TILE__64 2D
    SET_TILE_MODE_INFO(TILE__64_2D_128bpe,       1024,       64,        1,        32,        64,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_64bpe,        1024,       64,        1,        64,        64,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_32bpe,         512,      128,        1,        64,       128,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_16bpe,         512,      128,        1,       128,       128,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_8bpe,          256,      256,        1,       128,       256,         1)

    // TILE__64 2D 2X
    if(pGmmLibContext->GetSkuTable().FtrXe2PlusTiling)
    {
        SET_TILE_MODE_INFO(TILE__64_2D_2X_128bpe,     1024,      32,        1,        32,        32,         1) 
    }
    else
    {
        SET_TILE_MODE_INFO(TILE__64_2D_2X_128bpe,     512,       64,        1,        32,        32,         1) 
    }

    SET_TILE_MODE_INFO(TILE__64_2D_2X_64bpe,      512,       64,        1,        64,        32,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_2X_32bpe,      256,      128,        1,        64,        64,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_2X_16bpe,      256,      128,        1,       128,        64,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_2X_8bpe,       128,      256,        1,       128,       128,         1)

    // TILE__64 2D 4X
    SET_TILE_MODE_INFO(TILE__64_2D_4X_128bpe,     512,       32,        1,        16,        32,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_4X_64bpe,      512,       32,        1,        32,        32,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_4X_32bpe,      256,       64,        1,        32,        64,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_4X_16bpe,      256,       64,        1,        64,        64,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_4X_8bpe,       128,      128,        1,        64,       128,         1)

    // TILE__64 2D 8X
    SET_TILE_MODE_INFO(TILE__64_2D_8X_128bpe,     256,       32,        1,        8,         32,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_8X_64bpe,      256,       32,        1,        16,        32,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_8X_32bpe,      256,       32,        1,        16,        64,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_8X_16bpe,      128,       64,        1,        32,        64,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_8X_8bpe,       128,       64,        1,        32,       128,         1)

    // TILE__64 2D 16X
    SET_TILE_MODE_INFO(TILE__64_2D_16X_128bpe,     256,       16,        1,        8,         16,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_16X_64bpe,      128,       32,        1,        16,        16,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_16X_32bpe,      128,       32,        1,        16,        32,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_16X_16bpe,      128,       32,        1,        32,        32,         1)
    SET_TILE_MODE_INFO(TILE__64_2D_16X_8bpe,        64,       64,        1,        32,        64,         1)

    // TILE__64 3D
    SET_TILE_MODE_INFO(TILE__64_3D_128bpe,        256,       16,       16,         8,        16,         16)
    SET_TILE_MODE_INFO(TILE__64_3D_64bpe,         256,       16,       16,        16,        16,         16)
    SET_TILE_MODE_INFO(TILE__64_3D_32bpe,         128,       32,       16,        16,        32,         16)
    SET_TILE_MODE_INFO(TILE__64_3D_16bpe,          64,       32,       32,        16,        32,         32)
    SET_TILE_MODE_INFO(TILE__64_3D_8bpe,           64,       32,       32,        32,        32,         32)
    // clang-format off

//Extended CCS alignment for per bpp/Tiling CCS alignment
#define CCSRTALIGN(TileMode, HAlign, VAlign, DAlign, HDownscale, VDownscale) \
    {                                                                        \
        TexAlignEx.CCSEx[CCS_MODE(TileMode)].Align.Width      = HAlign;      \
        TexAlignEx.CCSEx[CCS_MODE(TileMode)].Align.Height     = VAlign;      \
        TexAlignEx.CCSEx[CCS_MODE(TileMode)].Align.Depth      = DAlign;      \
        TexAlignEx.CCSEx[CCS_MODE(TileMode)].Downscale.Width  = HDownscale;  \
        TexAlignEx.CCSEx[CCS_MODE(TileMode)].Downscale.Height = VDownscale;  \
        TexAlignEx.CCSEx[CCS_MODE(TileMode)].Downscale.Depth  = DAlign;      \
    }

    // clang-format off
//See "RT->CCS Sizing definitions" comments above for explanation on fields
/********* TileMode           HAlign,  VAlign,  DAlign,   HDownscale,  VDownscale ***/
CCSRTALIGN(TILE_YF_2D_8bpe,       256,     64,      1,         16,        16 );
CCSRTALIGN(TILE_YF_2D_16bpe,      256,     32,      1,         16,         8 );
CCSRTALIGN(TILE_YF_2D_32bpe,      128,     32,      1,          8,         8 );
CCSRTALIGN(TILE_YF_2D_64bpe,      128,     16,      1,          8,         4 );
CCSRTALIGN(TILE_YF_2D_128bpe,      64,     16,      1,          4,         4 );

CCSRTALIGN(TILE_YF_3D_8bpe,        64,     16,     16,          4,         4 );
CCSRTALIGN(TILE_YF_3D_16bpe,       32,     16,     16,          2,         4 );
CCSRTALIGN(TILE_YF_3D_32bpe,       32,     16,      8,          2,         4 );
CCSRTALIGN(TILE_YF_3D_64bpe,       32,      8,      8,          2,         2 );
CCSRTALIGN(TILE_YF_3D_128bpe,      16,      8,      8,          1,         2 );

CCSRTALIGN(TILE_YF_2D_2X_8bpe,    128,     64,      2,          8,        16 );
CCSRTALIGN(TILE_YF_2D_2X_16bpe,   128,     32,      2,          8,         8 );
CCSRTALIGN(TILE_YF_2D_2X_32bpe,    64,     32,      2,          4,         8 );
CCSRTALIGN(TILE_YF_2D_2X_64bpe,    64,     16,      2,          4,         4 );
CCSRTALIGN(TILE_YF_2D_2X_128bpe,   32,     16,      2,          2,         4 );

CCSRTALIGN(TILE_YF_2D_4X_8bpe,    128,     32,      4,          8,         8 );
CCSRTALIGN(TILE_YF_2D_4X_16bpe,   128,     16,      4,          8,         4 );
CCSRTALIGN(TILE_YF_2D_4X_32bpe,    64,     16,      4,          4,         4 );
CCSRTALIGN(TILE_YF_2D_4X_64bpe,    64,      8,      4,          4,         2 );
CCSRTALIGN(TILE_YF_2D_4X_128bpe,   32,      8,      4,          2,         2 );

CCSRTALIGN(TILE_YF_2D_8X_8bpe,     64,     32,      8,          4,         8 );
CCSRTALIGN(TILE_YF_2D_8X_16bpe,    64,     16,      8,          4,         4 );
CCSRTALIGN(TILE_YF_2D_8X_32bpe,    32,     16,      8,          2,         4 );
CCSRTALIGN(TILE_YF_2D_8X_64bpe,    32,      8,      8,          2,         2 );
CCSRTALIGN(TILE_YF_2D_8X_128bpe,   16,      8,      8,          1,         2 );

CCSRTALIGN(TILE_YF_2D_16X_8bpe,    64,     16,     16,          4,         4 );
CCSRTALIGN(TILE_YF_2D_16X_16bpe,   64,      8,     16,          4,         2 );
CCSRTALIGN(TILE_YF_2D_16X_32bpe,   32,      8,     16,          2,         2 );
CCSRTALIGN(TILE_YF_2D_16X_64bpe,   32,      4,     16,          2,         1 );
CCSRTALIGN(TILE_YF_2D_16X_128bpe,  16,      4,     16,          1,         1 );

CCSRTALIGN(TILE_YS_2D_8bpe,       128,    128,      1,          8,        32 );
CCSRTALIGN(TILE_YS_2D_16bpe,      128,     64,      1,          8,        16 );
CCSRTALIGN(TILE_YS_2D_32bpe,       64,     64,      1,          4,        16 );
CCSRTALIGN(TILE_YS_2D_64bpe,       64,     32,      1,          4,         8 );
CCSRTALIGN(TILE_YS_2D_128bpe,      32,     32,      1,          2,         8 );

CCSRTALIGN(TILE_YS_3D_8bpe,        32,     16,     32,          2,         4 );
CCSRTALIGN(TILE_YS_3D_16bpe,       16,     16,     32,          1,         4 );
CCSRTALIGN(TILE_YS_3D_32bpe,       16,     16,     16,          1,         4 );
CCSRTALIGN(TILE_YS_3D_64bpe,       16,      8,     16,          1,         2 );
CCSRTALIGN(TILE_YS_3D_128bpe,       8,      8,     16,         -2,         2 );

CCSRTALIGN(TILE_YS_2D_2X_8bpe,    128,    128,      1,          8,        32 );
CCSRTALIGN(TILE_YS_2D_2X_16bpe,   128,     64,      1,          8,        16 );
CCSRTALIGN(TILE_YS_2D_2X_32bpe,    64,     64,      1,          4,        16 );
CCSRTALIGN(TILE_YS_2D_2X_64bpe,    64,     32,      1,          4,         8 );
CCSRTALIGN(TILE_YS_2D_2X_128bpe,   32,     32,      1,          2,         8 );

CCSRTALIGN(TILE_YS_2D_4X_8bpe,    128,    128,      1,          8,        32 );
CCSRTALIGN(TILE_YS_2D_4X_16bpe,   128,     64,      1,          8,        16 );
CCSRTALIGN(TILE_YS_2D_4X_32bpe,    64,     64,      1,          4,        16 );
CCSRTALIGN(TILE_YS_2D_4X_64bpe,    64,     32,      1,          4,         8 );
CCSRTALIGN(TILE_YS_2D_4X_128bpe,   32,     32,      1,          2,         8 );

CCSRTALIGN(TILE_YS_2D_8X_8bpe,     64,    128,      2,          4,        32 );
CCSRTALIGN(TILE_YS_2D_8X_16bpe,    64,     64,      2,          4,        16 );
CCSRTALIGN(TILE_YS_2D_8X_32bpe,    32,     64,      2,          2,        16 );
CCSRTALIGN(TILE_YS_2D_8X_64bpe,    32,     32,      2,          2,         8 );
CCSRTALIGN(TILE_YS_2D_8X_128bpe,   16,     32,      2,          1,         8 );

CCSRTALIGN(TILE_YS_2D_16X_8bpe,    64,     64,      4,          4,        16 );
CCSRTALIGN(TILE_YS_2D_16X_16bpe,   64,     32,      4,          4,         8 );
CCSRTALIGN(TILE_YS_2D_16X_32bpe,   32,     32,      4,          2,         8 );
CCSRTALIGN(TILE_YS_2D_16X_64bpe,   32,     16,      4,          2,         4 );
CCSRTALIGN(TILE_YS_2D_16X_128bpe,  16,     16,      4,          1,         4 );
#undef CCSRTALIGN
// clang-format on

#define FCRECTALIGN(TileMode, bpp, HAlign, VAlign, DAlign, HDownscale, VDownscale) \
    {                                                                              \
        FCTileMode[FCMode(TileMode, bpp)].Align.Width      = HAlign;               \
        FCTileMode[FCMode(TileMode, bpp)].Align.Height     = VAlign;               \
        FCTileMode[FCMode(TileMode, bpp)].Align.Depth      = DAlign;               \
        FCTileMode[FCMode(TileMode, bpp)].Downscale.Width  = HDownscale;           \
        FCTileMode[FCMode(TileMode, bpp)].Downscale.Height = VDownscale;           \
        FCTileMode[FCMode(TileMode, bpp)].Downscale.Depth  = 1;                    \
    }

    // clang-format off
FCRECTALIGN(LEGACY_TILE_Y    ,   8, 512,  32, 1,  256, 16);
FCRECTALIGN(LEGACY_TILE_Y    ,  16, 256,  32, 1, 128, 16);
FCRECTALIGN(LEGACY_TILE_Y    ,  32, 128,  32, 1,  64, 16);
FCRECTALIGN(LEGACY_TILE_Y    ,  64,  64,  32, 1, 32, 16);
FCRECTALIGN(LEGACY_TILE_Y    , 128,  32,  32, 1, 16, 16);

FCRECTALIGN(TILE_YF_2D_8bpe  ,   8, 256,  64, 1, 128, 32);
FCRECTALIGN(TILE_YF_2D_16bpe ,  16, 256,  32, 1, 128, 16);
FCRECTALIGN(TILE_YF_2D_32bpe ,  32, 128,  32, 1,  64, 16);
FCRECTALIGN(TILE_YF_2D_64bpe ,  64, 128,  16, 1,  64,  8);
FCRECTALIGN(TILE_YF_2D_128bpe, 128,  64,  16, 1,  32,  8);

FCRECTALIGN(TILE_YS_2D_8bpe  ,   8, 128, 128,  1, 64, 64);
FCRECTALIGN(TILE_YS_2D_16bpe ,  16, 128,  64,  1, 64, 32);
FCRECTALIGN(TILE_YS_2D_32bpe ,  32,  64,  64,  1, 32, 32);
FCRECTALIGN(TILE_YS_2D_64bpe ,  64,  64,  32,  1, 32, 16);
FCRECTALIGN(TILE_YS_2D_128bpe, 128,  32,  32,  1, 16, 16);

if(pGmmLibContext->GetSkuTable().FtrXe2Compression)
{   

    FCRECTALIGN(TILE4           ,   8, 64, 4, 1, 64, 4);
    FCRECTALIGN(TILE4           ,  16, 32, 4, 1, 32, 4);
    FCRECTALIGN(TILE4           ,  32, 16, 4, 1, 16, 4);
    FCRECTALIGN(TILE4           ,  64, 8,  4, 1, 8, 4);
    FCRECTALIGN(TILE4           , 128, 4,  4, 1, 4, 4);

    FCRECTALIGN(TILE__64_2D_8bpe  ,   8, 64, 4, 1, 64, 4);
    FCRECTALIGN(TILE__64_2D_16bpe ,  16, 32, 4, 1, 32, 4);
    FCRECTALIGN(TILE__64_2D_32bpe ,  32, 16, 4, 1, 16, 4);
    FCRECTALIGN(TILE__64_2D_64bpe ,  64,  8, 4, 1, 8,  4);
    FCRECTALIGN(TILE__64_2D_128bpe, 128,  4, 4, 1, 4,  4);

    FCRECTALIGN(TILE__64_3D_8bpe  ,   8,  64,  32, 32,  4, 8);
    FCRECTALIGN(TILE__64_3D_16bpe ,  16,  32,  32, 32,  8, 4);
    FCRECTALIGN(TILE__64_3D_32bpe ,  32,  32,  32, 16,  4, 4);
    FCRECTALIGN(TILE__64_3D_64bpe ,  64,  32,  16, 16,  4, 4);
    FCRECTALIGN(TILE__64_3D_128bpe, 128,  16,  16, 16,  4, 4);
}
else
{
    FCRECTALIGN(TILE4           ,   8, 1024, 16,  1, 1024, 16);
    FCRECTALIGN(TILE4           ,  16,  512, 16,  1, 512, 16);
    FCRECTALIGN(TILE4           ,  32,  256,  16, 1,  256, 16);
    FCRECTALIGN(TILE4           ,  64,  128,  16, 1, 128, 16);
    FCRECTALIGN(TILE4           , 128,   64,  16, 1,  64, 16);

    FCRECTALIGN(TILE__64_2D_8bpe  ,   8, 128, 128, 1,  128, 128);
    FCRECTALIGN(TILE__64_2D_16bpe ,  16, 128,  64, 1,  128, 64);
    FCRECTALIGN(TILE__64_2D_32bpe ,  32,  64,  64, 1,   64, 64);
    FCRECTALIGN(TILE__64_2D_64bpe ,  64,  64,  32, 1,  64, 32);
    FCRECTALIGN(TILE__64_2D_128bpe, 128,  32,  32, 1,  32, 32);

    FCRECTALIGN(TILE__64_3D_8bpe  ,   8,  1,  1, 1,  1, 1);
    FCRECTALIGN(TILE__64_3D_16bpe ,  16,  1,  1, 1,  1, 1);
    FCRECTALIGN(TILE__64_3D_32bpe ,  32,  1,  1, 1,  1, 1);
    FCRECTALIGN(TILE__64_3D_64bpe ,  64,  1,  1, 1,  1, 1);
    FCRECTALIGN(TILE__64_3D_128bpe, 128,  1,  1, 1,  1, 1);

    
}
#undef FCRECTALIGN

    // clang-format on
    Data.NoOfBitsSupported                = 39;
    Data.HighestAcceptablePhysicalAddress = GFX_MASK_LARGE(0, 38);
	
    if (GFX_GET_CURRENT_PRODUCT(Data.Platform) >= IGFX_BMG)
    {
        Data.NoOfBitsSupported                = 52;
        Data.HighestAcceptablePhysicalAddress = GFX_MASK_LARGE(0, 51);
    }
    if(GFX_GET_CURRENT_PRODUCT(Data.Platform) == IGFX_PVC)
    {
        Data.NoOfBitsSupported                = 52;
        Data.HighestAcceptablePhysicalAddress = GFX_MASK_LARGE(0, 51);
    }
    else if(GFX_GET_CURRENT_PRODUCT(Data.Platform) == IGFX_ALDERLAKE_S ||
       (GFX_GET_CURRENT_PRODUCT(Data.Platform) == IGFX_ALDERLAKE_P) || 
       (GFX_GET_CURRENT_PRODUCT(Data.Platform) == IGFX_ALDERLAKE_N) ||
       (GFX_GET_CURRENT_PRODUCT(Data.Platform) >= IGFX_XE_HP_SDV))
    {
        Data.NoOfBitsSupported                = 46;
        Data.HighestAcceptablePhysicalAddress = GFX_MASK_LARGE(0, 45);
    }
}